

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall
YAJLScan::MCU::MCU(MCU *this,bitio_stream *bstream,YAJLTables *tables,YAJLScanHeaderSpec *spec)

{
  i16 *piVar1;
  undefined8 *puVar2;
  u16 uVar3;
  ulong uVar4;
  undefined6 extraout_var;
  ssize_t sVar5;
  ssize_t sVar6;
  YAJLArithmeticTable *__nbytes;
  short sVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  byte bVar8;
  YAJLArithmeticTable *pYVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  YAJLEntropyTable ac_table;
  YAJLEntropyTable dc_table;
  YAJLEntropyTable local_68;
  YAJLEntropyTable local_48;
  
  piVar1 = this->xcof;
  this->xcof[0x38] = 0;
  this->xcof[0x39] = 0;
  this->xcof[0x3a] = 0;
  this->xcof[0x3b] = 0;
  this->xcof[0x3c] = 0;
  this->xcof[0x3d] = 0;
  this->xcof[0x3e] = 0;
  this->xcof[0x3f] = 0;
  this->xcof[0x30] = 0;
  this->xcof[0x31] = 0;
  this->xcof[0x32] = 0;
  this->xcof[0x33] = 0;
  this->xcof[0x34] = 0;
  this->xcof[0x35] = 0;
  this->xcof[0x36] = 0;
  this->xcof[0x37] = 0;
  this->xcof[0x28] = 0;
  this->xcof[0x29] = 0;
  this->xcof[0x2a] = 0;
  this->xcof[0x2b] = 0;
  this->xcof[0x2c] = 0;
  this->xcof[0x2d] = 0;
  this->xcof[0x2e] = 0;
  this->xcof[0x2f] = 0;
  this->xcof[0x20] = 0;
  this->xcof[0x21] = 0;
  this->xcof[0x22] = 0;
  this->xcof[0x23] = 0;
  this->xcof[0x24] = 0;
  this->xcof[0x25] = 0;
  this->xcof[0x26] = 0;
  this->xcof[0x27] = 0;
  this->xcof[0x18] = 0;
  this->xcof[0x19] = 0;
  this->xcof[0x1a] = 0;
  this->xcof[0x1b] = 0;
  this->xcof[0x1c] = 0;
  this->xcof[0x1d] = 0;
  this->xcof[0x1e] = 0;
  this->xcof[0x1f] = 0;
  this->xcof[0x10] = 0;
  this->xcof[0x11] = 0;
  this->xcof[0x12] = 0;
  this->xcof[0x13] = 0;
  this->xcof[0x14] = 0;
  this->xcof[0x15] = 0;
  this->xcof[0x16] = 0;
  this->xcof[0x17] = 0;
  this->xcof[8] = 0;
  this->xcof[9] = 0;
  this->xcof[10] = 0;
  this->xcof[0xb] = 0;
  this->xcof[0xc] = 0;
  this->xcof[0xd] = 0;
  this->xcof[0xe] = 0;
  this->xcof[0xf] = 0;
  this->xcof[0] = 0;
  this->xcof[1] = 0;
  this->xcof[2] = 0;
  this->xcof[3] = 0;
  this->xcof[4] = 0;
  this->xcof[5] = 0;
  this->xcof[6] = 0;
  this->xcof[7] = 0;
  this->component_id = spec->component_selector + 0xff;
  uVar4 = (ulong)((uint)spec->dc_selector * 0x30);
  local_48.arithmetic_table =
       *(YAJLArithmeticTable **)((long)&tables->etables[0][0].arithmetic_table + uVar4);
  puVar2 = (undefined8 *)((long)&tables->etables[0][0].marker + uVar4);
  local_48._0_8_ = *puVar2;
  local_48.huffman_table = (YAJLHuffmanTable *)puVar2[1];
  uVar4 = (ulong)((uint)spec->ac_selector * 0x30);
  __nbytes = *(YAJLArithmeticTable **)((long)&tables->etables[0][1].arithmetic_table + uVar4);
  puVar2 = (undefined8 *)((long)&tables->etables[0][1].marker + uVar4);
  local_68._0_8_ = *puVar2;
  local_68.huffman_table = (YAJLHuffmanTable *)puVar2[1];
  local_68.arithmetic_table = __nbytes;
  uVar3 = YAJLEntropyTable::decode(&local_48);
  pYVar9 = (YAJLArithmeticTable *)(CONCAT62(extraout_var,uVar3) & 0xffffffff);
  bVar8 = (byte)pYVar9;
  if (bVar8 == 0) {
    sVar7 = 0;
  }
  else {
    sVar5 = bitio::bitio_stream::read(bstream,1,__buf,(size_t)__nbytes);
    uVar12 = (uVar3 & 0xff) - 1;
    sVar6 = bitio::bitio_stream::read(bstream,uVar12 & 0xff,__buf_00,(size_t)__nbytes);
    if (bVar8 == 1) {
      sVar7 = (ushort)(sVar5 == 1) * 2 + -1;
    }
    else if (sVar5 == 1) {
      sVar7 = (short)(1 << ((byte)uVar12 & 0x1f)) + (short)sVar6;
      __nbytes = (YAJLArithmeticTable *)(ulong)uVar12;
    }
    else {
      sVar7 = (short)(-1 << (bVar8 & 0x1f)) + (short)sVar6 + 1;
      __nbytes = pYVar9;
    }
  }
  *piVar1 = sVar7;
  iVar11 = 1;
  do {
    do {
      uVar3 = YAJLEntropyTable::decode(&local_68);
    } while ((uVar3 & 0xff) == 0);
    if ((uVar3 & 0xf) == 0) {
      sVar7 = 0;
    }
    else {
      uVar12 = uVar3 & 0xf;
      sVar5 = bitio::bitio_stream::read(bstream,1,__buf_01,(size_t)__nbytes);
      sVar6 = bitio::bitio_stream::read(bstream,uVar12 - 1 & 0xff,__buf_02,(size_t)__nbytes);
      if (uVar12 == 1) {
        sVar7 = (ushort)(sVar5 == 1) * 2 + -1;
      }
      else if (sVar5 == 1) {
        sVar7 = (short)(1 << ((byte)(uVar12 - 1) & 0x1f)) + (short)sVar6;
      }
      else {
        sVar7 = (short)(-1 << (sbyte)uVar12) + (short)sVar6 + 1;
      }
    }
    iVar10 = iVar11 + (uint)((uVar3 & 0xff) >> 4);
    iVar11 = iVar10 + 1;
    piVar1[*(int *)(scanorders::ZZ + (long)iVar10 * 4)] = sVar7;
    __nbytes = (YAJLArithmeticTable *)piVar1;
  } while( true );
}

Assistant:

YAJLScan::MCU::MCU(bitio::bitio_stream *bstream, YAJLTables *tables, YAJLScanHeaderSpec *spec) : MCU() {
    component_id = spec->component_selector - 1;
    auto dc_table = tables->etables[spec->dc_selector][0];
    auto ac_table = tables->etables[spec->ac_selector][1];
    u8 ebits = dc_table.decode();
    xcof[0] = extract_xv(bstream, ebits);
    fill_xac(bstream, &ac_table);
}